

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void __thiscall
pybind11::cpp_function::cpp_function<void,Person,std::shared_ptr<Job>const&>
          (cpp_function *this,offset_in_Job_to_subr f)

{
  offset_in_Job_to_subr in_RDX;
  type local_40;
  offset_in_Job_to_subr local_30;
  offset_in_Job_to_subr f_local;
  cpp_function *local_20;
  cpp_function *this_local;
  
  local_30 = f;
  f_local = in_RDX;
  local_20 = this;
  this_local = (cpp_function *)f;
  function::function(&this->super_function);
  local_40._8_8_ = f_local;
  local_40.f = local_30;
  initialize<pybind11::cpp_function::initialize<void,Person,std::shared_ptr<Job>const&>(void(Person::*)(std::shared_ptr<Job>const&))::_lambda(Person*,std::shared_ptr<Job>const&)_1_,void,Person*,std::shared_ptr<Job>const&>
            (this,&local_40,(_func_void_Person_ptr_shared_ptr<Job>_ptr *)0x0);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...) PYBIND11_NOEXCEPT_SPECIFIER, const Extra&... extra) {
        initialize([f](Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*) (Class *, Arg...) PYBIND11_NOEXCEPT_SPECIFIER) nullptr, extra...);
    }